

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QString>::emplace<QString_const&>
          (QHash<QString,_QString> *this,QString *key,QString *args)

{
  long lVar1;
  bool bVar2;
  QString *in_RSI;
  QHash<QString,_QString> *in_RDI;
  long in_FS_OFFSET;
  QHash<QString,_QString> copy;
  QString *in_stack_ffffffffffffff88;
  QString *in_stack_ffffffffffffff90;
  QString *in_stack_ffffffffffffff98;
  QString *in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QString,_QString>::isDetached((QHash<QString,_QString> *)in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::shouldGrow(in_RDI->d);
    if (bVar2) {
      QString::QString(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)QHash<QString,_QString>::emplace_helper<QString>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QString::~QString((QString *)0x1797ee);
    }
    else {
      local_38 = (piter)emplace_helper<QString_const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<QString,_QString>::QHash
              ((QHash<QString,_QString> *)in_stack_ffffffffffffff90,
               (QHash<QString,_QString> *)in_stack_ffffffffffffff88);
    QHash<QString,_QString>::detach((QHash<QString,_QString> *)in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QString_const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<QString,_QString>::~QHash((QHash<QString,_QString> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }